

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O0

PHYSFS_ErrorCode zlib_error_code(int rc)

{
  PHYSFS_ErrorCode local_c;
  int rc_local;
  
  switch(rc) {
  case 0:
    local_c = PHYSFS_ERR_OK;
    break;
  case 1:
    local_c = PHYSFS_ERR_OK;
    break;
  case -4:
    local_c = PHYSFS_ERR_OUT_OF_MEMORY;
    break;
  default:
    local_c = PHYSFS_ERR_CORRUPT;
    break;
  case -1:
    local_c = PHYSFS_ERR_IO;
  }
  return local_c;
}

Assistant:

static PHYSFS_ErrorCode zlib_error_code(int rc)
{
    switch (rc)
    {
        case Z_OK: return PHYSFS_ERR_OK;  /* not an error. */
        case Z_STREAM_END: return PHYSFS_ERR_OK; /* not an error. */
        case Z_ERRNO: return PHYSFS_ERR_IO;
        case Z_MEM_ERROR: return PHYSFS_ERR_OUT_OF_MEMORY;
        default: return PHYSFS_ERR_CORRUPT;
    } /* switch */
}